

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qdatetimeedit.cpp
# Opt level: O0

void __thiscall QDateTimeEdit::setMinimumDateTime(QDateTimeEdit *this,QDateTime *dt)

{
  bool bVar1;
  uint uVar2;
  QDateTimeEditPrivate *lhs;
  long in_FS_OFFSET;
  QDateTimeEditPrivate *d;
  QDateTime max;
  QDateTime m;
  QDateTime *in_stack_ffffffffffffff68;
  QDateTime *pQVar3;
  QDate *in_stack_ffffffffffffff70;
  bool local_81;
  undefined1 *local_68;
  undefined1 *local_60;
  QDate local_58;
  undefined8 local_50;
  QVariant local_48;
  QVariant local_28;
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  lhs = d_func((QDateTimeEdit *)0x558c10);
  uVar2 = QDateTime::isValid();
  local_81 = false;
  if ((uVar2 & 1) != 0) {
    local_50 = QDateTime::date();
    QDate::QDate(&local_58,100,1,1);
    local_81 = operator>=(in_stack_ffffffffffffff70,(QDate *)in_stack_ffffffffffffff68);
  }
  if (local_81 != false) {
    local_60 = &DAT_aaaaaaaaaaaaaaaa;
    QDateTime::toTimeZone((QTimeZone *)&local_60);
    local_68 = &DAT_aaaaaaaaaaaaaaaa;
    ::QVariant::toDateTime();
    ::QVariant::QVariant(&local_28,(QDateTime *)&local_60);
    bVar1 = operator>((QDateTime *)lhs,in_stack_ffffffffffffff68);
    if (bVar1) {
      pQVar3 = (QDateTime *)&local_68;
    }
    else {
      pQVar3 = (QDateTime *)&local_60;
    }
    ::QVariant::QVariant(&local_48,pQVar3);
    (**(code **)(*(long *)&(lhs->super_QAbstractSpinBoxPrivate).super_QWidgetPrivate + 0xb0))
              (lhs,&local_28,&local_48);
    ::QVariant::~QVariant(&local_48);
    ::QVariant::~QVariant(&local_28);
    QDateTime::~QDateTime((QDateTime *)&local_68);
    QDateTime::~QDateTime((QDateTime *)&local_60);
  }
  if (*(long *)(in_FS_OFFSET + 0x28) != local_8) {
    __stack_chk_fail();
  }
  return;
}

Assistant:

void QDateTimeEdit::setMinimumDateTime(const QDateTime &dt)
{
    Q_D(QDateTimeEdit);
    if (dt.isValid() && dt.date() >= QDATETIMEEDIT_DATE_MIN) {
        const QDateTime m = dt.toTimeZone(d->timeZone);
        const QDateTime max = d->maximum.toDateTime();
        d->setRange(m, (max > m ? max : m));
    }
}